

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx-prettyprint.h
# Opt level: O0

string * pretty_print::
         quoting_handler<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>_>
         ::toString(pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>
                    *x)

{
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>
  *in_RDI;
  ostringstream out;
  ostringstream *this;
  ostringstream local_188 [392];
  
  this = local_188;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)this,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return (string *)in_RDI;
}

Assistant:

static std::string toString(const T& x)
        {
            std::ostringstream out;
            out << x;
            return out.str();
        }